

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall capnp::_::OrphanBuilder::asDataReader(OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  byte bVar2;
  ReadLimiter *pRVar3;
  word *pwVar4;
  Arena *pAVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  SegmentBuilder **ppSVar13;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  OrphanBuilder *pOVar14;
  bool bVar15;
  Reader RVar16;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentBuilder *local_30;
  SegmentReader *newSegment;
  Fault f_2;
  
  this_00 = &_kjCondition;
  local_30 = this->segment;
  ppSVar13 = (SegmentBuilder **)this->location;
  uVar7 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) != 0 || uVar7 != 0) {
    if ((uVar7 & 3) == 2 && local_30 != (SegmentBuilder *)0x0) {
      iVar6 = (*((local_30->super_SegmentReader).arena)->_vptr_Arena[2])();
      local_30 = (SegmentBuilder *)CONCAT44(extraout_var,iVar6);
      _kjCondition.left = (SegmentReader **)&local_30;
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = local_30 != (SegmentBuilder *)0x0;
      if (local_30 == (SegmentBuilder *)0x0) {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x244,FAILED,"segment != nullptr",
                   "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition
                   ,(char (*) [49])"Message contains far pointer to unknown segment.");
      }
      else {
        uVar7 = (uint)(this->tag).content;
        uVar12 = (ulong)(uVar7 >> 3);
        uVar10 = (local_30->super_SegmentReader).ptr.size_;
        if ((long)uVar10 < (long)uVar12) {
          uVar12 = uVar10;
        }
        uVar9 = 2 - (ulong)((uVar7 & 4) == 0);
        if (uVar12 + uVar9 <= uVar10) {
          pOVar14 = (OrphanBuilder *)((local_30->super_SegmentReader).ptr.ptr + uVar12);
          pRVar3 = (local_30->super_SegmentReader).readLimiter;
          uVar10 = pRVar3->limit;
          if (uVar9 <= uVar10) {
            pRVar3->limit = uVar10 - uVar9;
            if (((this->tag).content & 4) != 0) {
              pAVar5 = (local_30->super_SegmentReader).arena;
              iVar6 = (*pAVar5->_vptr_Arena[2])
                                (pAVar5,(ulong)*(uint *)((long)&(pOVar14->tag).content + 4));
              newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar6);
              _kjCondition.left = &newSegment;
              _kjCondition.right = (void *)0x0;
              _kjCondition.op.content.ptr = " != ";
              _kjCondition.op.content.size_ = 5;
              _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
              if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x25f,FAILED,"newSegment != nullptr",
                           "_kjCondition,\"Message contains double-far pointer to unknown segment.\""
                           ,&_kjCondition,
                           (char (*) [56])"Message contains double-far pointer to unknown segment.")
                ;
LAB_00210104:
                ppSVar13 = (SegmentBuilder **)0x0;
                kj::_::Debug::Fault::~Fault(&f_2);
              }
              else {
                uVar7 = (uint)(pOVar14->tag).content;
                uVar8 = uVar7 & 3;
                _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar8);
                _kjCondition.right = anon_var_dwarf_b08b;
                _kjCondition.op.content.ptr = &DAT_00000005;
                _kjCondition.op.content.size_ = (size_t)(uVar8 == 2);
                if (uVar8 != 2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                            (&f_2,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                             ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                             "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                             (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                              *)&_kjCondition,
                             (char (*) [51])"Second word of double-far pad must be far pointer.");
                  goto LAB_00210104;
                }
                uVar12 = (ulong)(uVar7 >> 3);
                uVar10 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
                if ((long)uVar10 < (long)uVar12) {
                  uVar12 = uVar10;
                }
                ppSVar13 = (SegmentBuilder **)
                           ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar12);
                local_30 = (SegmentBuilder *)newSegment;
              }
              this = (OrphanBuilder *)&pOVar14->segment;
              goto LAB_0020fdc1;
            }
            ppSVar1 = &pOVar14->segment;
            uVar7 = (uint)(pOVar14->tag).content;
            lVar11 = (long)((int)uVar7 >> 2);
            this = pOVar14;
            if ((local_30 != (SegmentBuilder *)0x0) &&
               ((pwVar4 = (local_30->super_SegmentReader).ptr.ptr,
                ppSVar13 = (SegmentBuilder **)(pwVar4 + (local_30->super_SegmentReader).ptr.size_),
                lVar11 < (long)pwVar4 - (long)ppSVar1 >> 3 ||
                ((long)ppSVar13 - (long)ppSVar1 >> 3 < lVar11)))) goto LAB_0020fdc1;
            ppSVar13 = ppSVar1 + lVar11;
            goto LAB_0020fdcd;
          }
          (*((local_30->super_SegmentReader).arena)->_vptr_Arena[3])();
        }
        newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                   "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                   ,(DebugExpression<bool> *)&newSegment,
                   (char (*) [318])
                   "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                  );
      }
    }
    else {
LAB_0020fdc1:
      if (ppSVar13 == (SegmentBuilder **)0x0) goto LAB_0020ffd8;
      uVar7 = (uint)(this->tag).content;
LAB_0020fdcd:
      this_00 = &_kjCondition;
      uVar7 = uVar7 & 3;
      _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar7);
      _kjCondition.right = anon_var_dwarf_b08b;
      _kjCondition.op.content.ptr = &DAT_00000005;
      _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar7 == 1);
      if (uVar7 == 1) {
        bVar2 = *(byte *)((long)&(this->tag).content + 4);
        _kjCondition.left =
             (SegmentReader **)(CONCAT71(_kjCondition.left._1_7_,bVar2) & 0xffffffffffffff07);
        _kjCondition.left._0_2_ = CONCAT11(2,_kjCondition.left._0_1_);
        _kjCondition.right = anon_var_dwarf_b08b;
        _kjCondition.op.content.ptr = &DAT_00000005;
        bVar15 = (bVar2 & 7) == 2;
        _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,bVar15);
        if (bVar15) {
          uVar7 = *(uint *)((long)&(this->tag).content + 4) >> 3;
          if (local_30 == (SegmentBuilder *)0x0) {
LAB_0021008b:
            uVar10 = (ulong)uVar7;
            goto LAB_0020ffda;
          }
          uVar10 = (ulong)(uVar7 + 7 >> 3);
          if (((long)ppSVar13 - (long)(local_30->super_SegmentReader).ptr.ptr >> 3) + uVar10 <=
              (local_30->super_SegmentReader).ptr.size_) {
            pRVar3 = (local_30->super_SegmentReader).readLimiter;
            uVar12 = pRVar3->limit;
            if (uVar10 <= uVar12) {
              pRVar3->limit = uVar12 - uVar10;
              goto LAB_0021008b;
            }
            (*((local_30->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[320]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9e8,FAILED,"boundsCheck(segment, ptr, roundBytesUpToWords(size))",
                     "_kjCondition,\"Message contained out-of-bounds data pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [320])
                     "Message contained out-of-bounds data pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
        else {
          this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ElementSize,capnp::ElementSize>&,char_const(&)[85]>
                    ((Fault *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x9e2,FAILED,"ref->listRef.elementSize() == ElementSize::BYTE",
                     "_kjCondition,\"Schema mismatch: Message contains list pointer of non-bytes where data was \" \"expected.\""
                     ,(DebugComparison<capnp::ElementSize,_capnp::ElementSize> *)&_kjCondition,
                     (char (*) [85])
                     "Schema mismatch: Message contains list pointer of non-bytes where data was expected."
                    );
        }
      }
      else {
        this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[76]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x9dc,FAILED,"ref->kind() == WirePointer::LIST",
                   "_kjCondition,\"Schema mismatch: Message contains non-list pointer where data was expected.\""
                   ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                    &_kjCondition,
                   (char (*) [76])
                   "Schema mismatch: Message contains non-list pointer where data was expected.");
      }
    }
    kj::_::Debug::Fault::~Fault((Fault *)this_00);
  }
LAB_0020ffd8:
  ppSVar13 = (SegmentBuilder **)0x0;
  uVar10 = 0;
LAB_0020ffda:
  RVar16.super_ArrayPtr<const_unsigned_char>.size_ = uVar10;
  RVar16.super_ArrayPtr<const_unsigned_char>.ptr = (uchar *)ppSVar13;
  return (Reader)RVar16.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader OrphanBuilder::asDataReader() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readDataPointer(segment, tagAsPtr(), location, nullptr, ZERO * BYTES);
}